

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::GetKeyChordName(ImGuiKeyChord key_chord,char *out_buf,int out_buf_size)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  
  pcVar2 = "";
  if (((short)key_chord < 0) && (pcVar2 = "Super+", (GImGui->IO).ConfigMacOSXBehaviors != false)) {
    pcVar2 = "Cmd+";
  }
  pcVar4 = "Alt+";
  if (((uint)key_chord >> 0xe & 1) == 0) {
    pcVar4 = "";
  }
  pcVar5 = "Shift+";
  if (((uint)key_chord >> 0xd & 1) == 0) {
    pcVar5 = "";
  }
  pcVar3 = "Ctrl+";
  if (((uint)key_chord >> 0xc & 1) == 0) {
    pcVar3 = "";
  }
  pcVar1 = GetKeyName(key_chord & ~ImGuiMod_Mask_);
  ImFormatString(out_buf,(long)out_buf_size,"%s%s%s%s%s",pcVar3,pcVar5,pcVar4,pcVar2,pcVar1);
  return;
}

Assistant:

void ImGui::GetKeyChordName(ImGuiKeyChord key_chord, char* out_buf, int out_buf_size)
{
    ImGuiContext& g = *GImGui;
    ImFormatString(out_buf, (size_t)out_buf_size, "%s%s%s%s%s",
        (key_chord & ImGuiMod_Ctrl) ? "Ctrl+" : "",
        (key_chord & ImGuiMod_Shift) ? "Shift+" : "",
        (key_chord & ImGuiMod_Alt) ? "Alt+" : "",
        (key_chord & ImGuiMod_Super) ? (g.IO.ConfigMacOSXBehaviors ? "Cmd+" : "Super+") : "",
        GetKeyName((ImGuiKey)(key_chord & ~ImGuiMod_Mask_)));
}